

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singlylinkedlist.c
# Opt level: O2

LIST_ITEM_HANDLE
singlylinkedlist_find
          (SINGLYLINKEDLIST_HANDLE list,LIST_MATCH_FUNCTION match_function,void *match_context)

{
  LIST_ITEM_HANDLE pLVar1;
  _Bool _Var2;
  LOGGER_LOG p_Var3;
  
  if (match_function == (LIST_MATCH_FUNCTION)0x0 || list == (SINGLYLINKEDLIST_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/src/singlylinkedlist.c"
                ,"singlylinkedlist_find",0xe9,1,"Invalid argument (list=%p, match_function=%p)",list
                ,match_function);
    }
  }
  else {
    while (pLVar1 = list->head, pLVar1 != (LIST_ITEM_HANDLE)0x0) {
      _Var2 = (*match_function)(pLVar1,match_context);
      if (_Var2) {
        return pLVar1;
      }
      list = (SINGLYLINKEDLIST_HANDLE)&pLVar1->next;
    }
  }
  return (LIST_ITEM_HANDLE)0x0;
}

Assistant:

LIST_ITEM_HANDLE singlylinkedlist_find(SINGLYLINKEDLIST_HANDLE list, LIST_MATCH_FUNCTION match_function, const void* match_context)
{
    LIST_ITEM_HANDLE result;

    if ((list == NULL) ||
        (match_function == NULL))
    {
        LogError("Invalid argument (list=%p, match_function=%p)", list, match_function);
        /* Codes_SRS_LIST_01_012: [If the list or the match_function argument is NULL, singlylinkedlist_find shall return NULL.] */
        result = NULL;
    }
    else
    {
        LIST_INSTANCE* list_instance = (LIST_INSTANCE*)list;
        LIST_ITEM_INSTANCE* current = list_instance->head;

        /* Codes_SRS_LIST_01_011: [singlylinkedlist_find shall iterate through all items in a list and return the first one that satisfies a certain match function.] */
        while (current != NULL)
        {
            /* Codes_SRS_LIST_01_014: [list find shall determine whether an item satisfies the match criteria by invoking the match function for each item in the list until a matching item is found.] */
            /* Codes_SRS_LIST_01_013: [The match_function shall get as arguments the list item being attempted to be matched and the match_context as is.] */
            if (match_function((LIST_ITEM_HANDLE)current, match_context) == true)
            {
                /* Codes_SRS_LIST_01_017: [If the match function returns true, singlylinkedlist_find shall consider that item as matching.] */
                break;
            }

            /* Codes_SRS_LIST_01_016: [If the match function returns false, singlylinkedlist_find shall consider that item as not matching.] */
            current = (LIST_ITEM_INSTANCE*)current->next;
        }

        if (current == NULL)
        {
            /* Codes_SRS_LIST_01_015: [If the list is empty, singlylinkedlist_find shall return NULL.] */
            result = NULL;
        }
        else
        {
            result = current;
        }
    }

    return result;
}